

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterCase::init
          (AtomicCounterCase *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ContextType type;
  GLSLVersion version;
  int extraout_EAX;
  Program *this_00;
  Shader *pSVar3;
  DefaultBlock *this_01;
  VariableDeclaration decl;
  string local_d0;
  VarType local_b0;
  Layout local_94;
  VariableDeclaration local_80;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  this_00 = (Program *)operator_new(0x48);
  ProgramInterfaceDefinition::Program::Program(this_00);
  this->m_program = this_00;
  pSVar3 = ProgramInterfaceDefinition::Program::addShader(this_00,SHADERTYPE_COMPUTE,version);
  glu::VarType::VarType(&local_b0,TYPE_UINT_ATOMIC_COUNTER,PRECISION_LAST);
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"binding1_counter1","");
  glu::Layout::Layout(&local_94,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_80,&local_b0,&local_d0,STORAGE_UNIFORM,INTERPOLATION_LAST,&local_94,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_b0);
  local_80.layout.binding = 1;
  this_01 = &pSVar3->m_defaultBlock;
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
            (&this_01->variables,&local_80);
  paVar2 = &local_80.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.name._M_dataplus._M_p,local_80.name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_80.varType);
  glu::VarType::VarType(&local_b0,TYPE_UINT_ATOMIC_COUNTER,PRECISION_LAST);
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"binding1_counter2","");
  glu::Layout::Layout(&local_94,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_80,&local_b0,&local_d0,STORAGE_UNIFORM,INTERPOLATION_LAST,&local_94,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_b0);
  local_80.layout.binding = 1;
  local_80.layout.offset = 8;
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
            (&this_01->variables,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.name._M_dataplus._M_p,local_80.name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_80.varType);
  glu::VarType::VarType(&local_b0,TYPE_UINT_ATOMIC_COUNTER,PRECISION_LAST);
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"binding2_counter1","");
  glu::Layout::Layout(&local_94,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_80,&local_b0,&local_d0,STORAGE_UNIFORM,INTERPOLATION_LAST,&local_94,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_b0);
  local_80.layout.binding = 2;
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
            (&this_01->variables,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.name._M_dataplus._M_p,local_80.name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_80.varType);
  return extraout_EAX;
}

Assistant:

void AtomicCounterCase::init (void)
{
	ProgramInterfaceDefinition::Shader* shader;
	glu::GLSLVersion glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());

	m_program = new ProgramInterfaceDefinition::Program();
	shader = m_program->addShader(glu::SHADERTYPE_COMPUTE, glslVersion);

	{
		glu::VariableDeclaration decl(glu::VarType(glu::TYPE_UINT_ATOMIC_COUNTER, glu::PRECISION_LAST), "binding1_counter1", glu::STORAGE_UNIFORM);
		decl.layout.binding = 1;
		shader->getDefaultBlock().variables.push_back(decl);
	}
	{
		glu::VariableDeclaration decl(glu::VarType(glu::TYPE_UINT_ATOMIC_COUNTER, glu::PRECISION_LAST), "binding1_counter2", glu::STORAGE_UNIFORM);
		decl.layout.binding = 1;
		decl.layout.offset = 8;

		shader->getDefaultBlock().variables.push_back(decl);
	}
	{
		glu::VariableDeclaration decl(glu::VarType(glu::TYPE_UINT_ATOMIC_COUNTER, glu::PRECISION_LAST), "binding2_counter1", glu::STORAGE_UNIFORM);
		decl.layout.binding = 2;
		shader->getDefaultBlock().variables.push_back(decl);
	}

	DE_ASSERT(m_program->isValid());
}